

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::ConditionalLineBreak(cmXMLWriter *this,bool condition)

{
  ulong local_20;
  size_t i;
  bool condition_local;
  cmXMLWriter *this_local;
  
  if (condition) {
    std::operator<<(this->Output,'\n');
    for (local_20 = 0; local_20 < this->Indent + this->Level; local_20 = local_20 + 1) {
      std::operator<<(this->Output,(string *)&this->IndentationElement);
    }
  }
  return;
}

Assistant:

void cmXMLWriter::ConditionalLineBreak(bool condition)
{
  if (condition) {
    this->Output << '\n';
    for (std::size_t i = 0; i < this->Indent + this->Level; ++i) {
      this->Output << this->IndentationElement;
    }
  }
}